

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RawFile.cpp
# Opt level: O0

void __thiscall RawFile::RawFile(RawFile *this,string *fname,int flags,int mode)

{
  int iVar1;
  char *__file;
  runtime_error *this_00;
  uint in_ECX;
  int in_EDX;
  int *in_RDI;
  string message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  string local_78 [32];
  string local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  string local_38 [32];
  uint local_18;
  int local_14;
  
  local_18 = in_ECX;
  local_14 = in_EDX;
  __file = (char *)std::__cxx11::string::c_str();
  iVar1 = open(__file,local_14,(ulong)local_18);
  *in_RDI = iVar1;
  if (*in_RDI < 0) {
    std::__cxx11::string::string(local_38);
    std::operator+(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    std::operator+(in_stack_ffffffffffffff78,(char *)in_RDI);
    std::__cxx11::string::operator+=(local_38,local_58);
    std::__cxx11::string::~string(local_58);
    std::__cxx11::string::~string(local_78);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,local_38);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

RawFile::RawFile(const std::string &fname, int flags, int mode) {
    fd = ::open(fname.c_str(), flags, mode);
    if (fd < 0) {
        std::string message;
        message += "RawFile::RawFile: open for " + fname + " failed";
        throw std::runtime_error(message);
    }
}